

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tif_dirwrite.c
# Opt level: O2

int TIFFWriteDirectoryTagRational
              (TIFF *tif,uint32_t *ndir,TIFFDirEntry *dir,uint16_t tag,double value)

{
  int iVar1;
  char *fmt;
  uint32_t uStack_38;
  uint32_t local_34;
  
  if (dir == (TIFFDirEntry *)0x0) {
    *ndir = *ndir + 1;
    iVar1 = 1;
  }
  else {
    if (0.0 <= value) {
      if (!NAN(value)) {
        DoubleToRational(value,&uStack_38,&local_34);
        if ((tif->tif_flags & 0x80) != 0) {
          TIFFSwabLong(&uStack_38);
          TIFFSwabLong(&local_34);
        }
        iVar1 = TIFFWriteDirectoryTagData(tif,ndir,dir,tag,5,1,8,&uStack_38);
        return iVar1;
      }
      fmt = "Not-a-number value is illegal";
    }
    else {
      fmt = "Negative value is illegal";
    }
    iVar1 = 0;
    TIFFErrorExtR(tif,"TIFFWriteDirectoryTagCheckedRational",fmt);
  }
  return iVar1;
}

Assistant:

static int TIFFWriteDirectoryTagRational(TIFF *tif, uint32_t *ndir,
                                         TIFFDirEntry *dir, uint16_t tag,
                                         double value)
{
    if (dir == NULL)
    {
        (*ndir)++;
        return (1);
    }
    return (TIFFWriteDirectoryTagCheckedRational(tif, ndir, dir, tag, value));
}